

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTupleExtract(PrintExpressionContents *this,TupleExtract *curr)

{
  printMedium(this->o,"tuple.extract ");
  std::ostream::_M_insert<unsigned_long>((ulong)this->o);
  return;
}

Assistant:

void visitTupleExtract(TupleExtract* curr) {
    printMedium(o, "tuple.extract ");
    o << curr->index;
  }